

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EAMAdapter.cpp
# Opt level: O1

void __thiscall
OpenMD::EAMAdapter::makeFuncfl
          (EAMAdapter *this,RealType latticeConstant,string *latticeType,int nrho,RealType drho,
          int nr,RealType dr,RealType rcut,vector<double,_std::allocator<double>_> *Z,
          vector<double,_std::allocator<double>_> *rho,vector<double,_std::allocator<double>_> *F)

{
  AtomType *pAVar1;
  bool bVar2;
  EAMParameters eamParam;
  undefined1 local_139;
  SimpleTypeData<OpenMD::FuncflParameters> *local_138;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_130;
  RealType local_128;
  RealType local_120;
  RealType local_118;
  RealType local_110;
  shared_ptr<OpenMD::GenericData> local_108;
  shared_ptr<OpenMD::GenericData> local_f8;
  undefined1 local_e0 [8];
  _Alloc_hider local_d8;
  size_type local_d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c8;
  RealType local_b8;
  FuncflParameters local_b0;
  
  local_128 = drho;
  local_120 = dr;
  local_118 = rcut;
  local_110 = latticeConstant;
  bVar2 = AtomType::hasProperty(this->at_,(string *)OpenMD::EAMtypeID_abi_cxx11_);
  if (bVar2) {
    AtomType::removeProperty(this->at_,(string *)OpenMD::EAMtypeID_abi_cxx11_);
    AtomType::removeProperty(this->at_,(string *)OpenMD::FuncflTypeID_abi_cxx11_);
  }
  local_e0._0_4_ = eamFuncfl;
  local_d8._M_p = (pointer)&local_c8;
  local_d0 = 0;
  local_c8._M_local_buf[0] = '\0';
  local_b0.atomicNumber = 0;
  local_b0.atomicMass = 0.0;
  local_b0.nrho = 0;
  local_b0.drho = 0.0;
  local_b0.nr = 0;
  local_b0.dr = 0.0;
  local_b0.rcut = 0.0;
  local_b0.Z.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_b0.Z.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_b0.Z.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_b0.rho.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_b0.rho.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_b0.rho.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_b0.F.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_b0.F.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_b0.F.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_b8 = local_110;
  std::__cxx11::string::_M_assign((string *)&local_d8);
  local_b0.drho = local_128;
  local_b0.dr = local_120;
  local_b0.rcut = local_118;
  local_b0.nrho = nrho;
  local_b0.nr = nr;
  std::vector<double,_std::allocator<double>_>::operator=(&local_b0.Z,Z);
  std::vector<double,_std::allocator<double>_>::operator=(&local_b0.rho,rho);
  std::vector<double,_std::allocator<double>_>::operator=(&local_b0.F,F);
  pAVar1 = this->at_;
  local_138 = (SimpleTypeData<OpenMD::FuncflParameters> *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<OpenMD::SimpleTypeData<OpenMD::EAMParameters>,std::allocator<OpenMD::SimpleTypeData<OpenMD::EAMParameters>>,std::__cxx11::string_const&,OpenMD::EAMParameters&>
            (&_Stack_130,(SimpleTypeData<OpenMD::EAMParameters> **)&local_138,
             (allocator<OpenMD::SimpleTypeData<OpenMD::EAMParameters>_> *)&local_139,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             OpenMD::EAMtypeID_abi_cxx11_,(EAMParameters *)local_e0);
  local_f8.super___shared_ptr<OpenMD::GenericData,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       &local_138->super_GenericData;
  local_f8.super___shared_ptr<OpenMD::GenericData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Stack_130._M_pi;
  local_138 = (SimpleTypeData<OpenMD::FuncflParameters> *)0x0;
  _Stack_130._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  AtomType::addProperty(pAVar1,&local_f8);
  if (local_f8.super___shared_ptr<OpenMD::GenericData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_f8.super___shared_ptr<OpenMD::GenericData,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (_Stack_130._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_130._M_pi);
  }
  pAVar1 = this->at_;
  local_138 = (SimpleTypeData<OpenMD::FuncflParameters> *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<OpenMD::SimpleTypeData<OpenMD::FuncflParameters>,std::allocator<OpenMD::SimpleTypeData<OpenMD::FuncflParameters>>,std::__cxx11::string_const&,OpenMD::FuncflParameters&>
            (&_Stack_130,&local_138,
             (allocator<OpenMD::SimpleTypeData<OpenMD::FuncflParameters>_> *)&local_139,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             OpenMD::FuncflTypeID_abi_cxx11_,&local_b0);
  local_108.super___shared_ptr<OpenMD::GenericData,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       &local_138->super_GenericData;
  local_108.super___shared_ptr<OpenMD::GenericData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Stack_130._M_pi;
  local_138 = (SimpleTypeData<OpenMD::FuncflParameters> *)0x0;
  _Stack_130._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  AtomType::addProperty(pAVar1,&local_108);
  if (local_108.super___shared_ptr<OpenMD::GenericData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_108.super___shared_ptr<OpenMD::GenericData,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (_Stack_130._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_130._M_pi);
  }
  if (local_b0.F.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
      ._M_start != (pointer)0x0) {
    operator_delete(local_b0.F.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_b0.F.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_b0.F.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_b0.rho.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_b0.rho.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_b0.rho.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_b0.rho.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_b0.Z.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
      ._M_start != (pointer)0x0) {
    operator_delete(local_b0.Z.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_b0.Z.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_b0.Z.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_p != &local_c8) {
    operator_delete(local_d8._M_p,
                    CONCAT71(local_c8._M_allocated_capacity._1_7_,local_c8._M_local_buf[0]) + 1);
  }
  return;
}

Assistant:

void EAMAdapter::makeFuncfl(RealType latticeConstant, std::string latticeType,
                              int nrho, RealType drho, int nr, RealType dr,
                              RealType rcut, vector<RealType> Z,
                              vector<RealType> rho, vector<RealType> F) {
    if (isEAM()) {
      at_->removeProperty(EAMtypeID);
      at_->removeProperty(FuncflTypeID);
    }

    EAMParameters eamParam {};
    FuncflParameters funcflParam {};

    eamParam.eamType         = eamFuncfl;
    eamParam.latticeConstant = latticeConstant;
    eamParam.latticeType     = latticeType;

    funcflParam.nrho = nrho;
    funcflParam.drho = drho;
    funcflParam.nr   = nr;
    funcflParam.dr   = dr;
    funcflParam.rcut = rcut;
    funcflParam.Z    = Z;
    funcflParam.rho  = rho;
    funcflParam.F    = F;

    at_->addProperty(std::make_shared<EAMData>(EAMtypeID, eamParam));
    at_->addProperty(std::make_shared<FuncflData>(FuncflTypeID, funcflParam));
  }